

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O1

genxStatus addAttribute(genxAttribute_conflict a,constUtf8 valuestr)

{
  collector *c;
  int *piVar1;
  genxWriter w;
  bool bVar2;
  uint uVar3;
  genxStatus gVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  genxStatus unaff_EBP;
  size_t __n;
  constUtf8 local_38;
  
  w = a->writer;
  local_38 = valuestr;
  if (valuestr == (constUtf8)0x0) {
LAB_001d6285:
    if (a->ns != (genxNamespace)0x0) {
      addNamespace(a->ns,(utf8)0x0);
    }
    if ((local_38 == (constUtf8)0x0) || (a->provided == 0)) {
      a->provided = 1;
      gVar4 = GENX_SUCCESS;
    }
    else {
      w->status = GENX_DUPLICATE_ATTRIBUTE;
      gVar4 = GENX_DUPLICATE_ATTRIBUTE;
    }
  }
  else {
    c = &a->value;
    (a->value).used = 0;
    do {
      if (*local_38 == '\0') {
        (a->value).buf[(a->value).used] = '\0';
        goto LAB_001d6285;
      }
      uVar3 = genxNextUnicodeChar(&local_38);
      if (uVar3 == 0xffffffff) {
        w->status = GENX_BAD_UTF8;
        gVar4 = GENX_BAD_UTF8;
LAB_001d60c6:
        bVar2 = false;
      }
      else {
        if ((int)uVar3 < 0) {
          uVar5 = 0;
        }
        else if ((int)uVar3 < 0x10000) {
          uVar5 = (uint)w->xmlChars[uVar3];
        }
        else {
          uVar5 = (uint)((int)uVar3 < 0x110000);
        }
        if (uVar5 == 0) {
          w->status = GENX_NON_XML_CHARACTER;
          gVar4 = GENX_NON_XML_CHARACTER;
          goto LAB_001d60c6;
        }
        if ((int)uVar3 < 0x22) {
          if (uVar3 != 9) {
            if (uVar3 == 10) {
              iVar6 = (a->value).used + 5;
              if ((a->value).space <= iVar6) {
                gVar4 = growCollector(w,c,iVar6);
                w->status = gVar4;
                if (gVar4 != GENX_SUCCESS) goto LAB_001d622c;
              }
              builtin_memcpy((a->value).buf + (a->value).used,"&#xA;",5);
            }
            else {
              if (uVar3 != 0xd) {
LAB_001d619e:
                __n = (long)local_38 - (long)valuestr;
                lVar7 = (long)(a->value).used + __n;
                if ((a->value).space <= lVar7) {
                  gVar4 = growCollector(w,c,(int)lVar7);
                  w->status = gVar4;
                  if (gVar4 != GENX_SUCCESS) {
                    bVar2 = false;
                    goto LAB_001d626f;
                  }
                }
                strncpy((char *)((a->value).buf + (a->value).used),(char *)valuestr,__n);
                piVar1 = &(a->value).used;
                *piVar1 = *piVar1 + (int)__n;
                goto LAB_001d6269;
              }
              iVar6 = (a->value).used + 5;
              if ((a->value).space <= iVar6) {
                gVar4 = growCollector(w,c,iVar6);
                w->status = gVar4;
                if (gVar4 != GENX_SUCCESS) goto LAB_001d622c;
              }
              builtin_memcpy((a->value).buf + (a->value).used,"&#xD;",5);
            }
LAB_001d6265:
            piVar1 = &(a->value).used;
            *piVar1 = *piVar1 + 5;
            goto LAB_001d6269;
          }
          iVar6 = (a->value).used + 5;
          if (iVar6 < (a->value).space) {
LAB_001d6144:
            builtin_memcpy((a->value).buf + (a->value).used,"&#x9;",5);
            goto LAB_001d6265;
          }
          gVar4 = growCollector(w,c,iVar6);
          w->status = gVar4;
          if (gVar4 == GENX_SUCCESS) goto LAB_001d6144;
LAB_001d622c:
          bVar2 = false;
        }
        else {
          if (uVar3 == 0x22) {
            iVar6 = (a->value).used + 6;
            if ((a->value).space <= iVar6) {
              gVar4 = growCollector(w,c,iVar6);
              w->status = gVar4;
              if (gVar4 != GENX_SUCCESS) goto LAB_001d622c;
            }
            builtin_memcpy((a->value).buf + (a->value).used,"&quot;",6);
            piVar1 = &(a->value).used;
            *piVar1 = *piVar1 + 6;
          }
          else {
            if (uVar3 == 0x26) {
              iVar6 = (a->value).used + 5;
              if ((a->value).space <= iVar6) {
                gVar4 = growCollector(w,c,iVar6);
                w->status = gVar4;
                if (gVar4 != GENX_SUCCESS) goto LAB_001d622c;
              }
              builtin_memcpy((a->value).buf + (a->value).used,"&amp;",5);
              goto LAB_001d6265;
            }
            if (uVar3 != 0x3c) goto LAB_001d619e;
            iVar6 = (a->value).used + 4;
            if ((a->value).space <= iVar6) {
              gVar4 = growCollector(w,c,iVar6);
              w->status = gVar4;
              if (gVar4 != GENX_SUCCESS) goto LAB_001d622c;
            }
            builtin_memcpy((a->value).buf + (a->value).used,"&lt;",4);
            piVar1 = &(a->value).used;
            *piVar1 = *piVar1 + 4;
          }
LAB_001d6269:
          bVar2 = true;
          valuestr = local_38;
          gVar4 = unaff_EBP;
        }
      }
LAB_001d626f:
      unaff_EBP = gVar4;
    } while (bVar2);
  }
  return gVar4;
}

Assistant:

static genxStatus addAttribute(genxAttribute a, constUtf8 valuestr)
{
  utf8 lastv = (utf8) valuestr;
  genxWriter w = a->writer;

  /* if valuestr not provided, this is an xmlns with a pre-cooked value */
  if (valuestr)
  {
    startCollect(&a->value);
    while (*valuestr)
    {
      int c = genxNextUnicodeChar(&valuestr);
      
      if (c == -1)
	return w->status = GENX_BAD_UTF8;
      
      if (!isXMLChar(w, c))
	return w->status = GENX_NON_XML_CHARACTER;
      
      switch(c)
      {
      case 9:
	collectPiece(w, &a->value, "&#x9;", 5);
	break;
      case 0xa:
	collectPiece(w, &a->value, "&#xA;", 5); 
	break;
      case 0xd:
	collectPiece(w, &a->value, "&#xD;", 5); 
	break;
      case '"':
	collectPiece(w, &a->value, "&quot;", 6);
	break;
      case '<':
	collectPiece(w, &a->value, "&lt;", 4);
	break;
      case '&':
	collectPiece(w, &a->value, "&amp;", 5);
	break;
	/*
      case '>':
	collectPiece(w, &a->value, "&gt;", 4);
	break;
	*/
      default:
	collectPiece(w, &a->value, (const char *) lastv, valuestr - lastv);
	break;
      }
      lastv = (utf8) valuestr;
    }
    endCollect(&a->value);
  }

  /* now add the namespace attribute; might fail if it's bee hand-declared */
  if (a->ns)
    addNamespace(a->ns, NULL);

  if (valuestr && a->provided)
    return w->status = GENX_DUPLICATE_ATTRIBUTE;
  a->provided = 1;

  return GENX_SUCCESS;
}